

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgreen-runner.c
# Opt level: O0

void usage(char *program_name)

{
  undefined8 in_RDI;
  
  printf("cgreen-runner for Cgreen unittest and mocking framework v%s\n\n","1.6.4");
  printf("Usage:\n    %s [--suite <name>] [--verbose] [--quiet] [--no-run] [--xml <prefix>] [--libxml2 <prefix>] [--help] (<library> [<test>])+\n\n"
         ,in_RDI);
  printf("Discover and run all or named cgreen test(s) from one or multiple\n");
  printf("dynamically loadable libraries.\n\n");
  printf("A single test can be run using the form [<context>:]<name> where <context> can\n");
  printf("be omitted if there is no context.\n\n");
  printf(
        "  -c --colours/colors\t\tUse colours to emphasis result (requires ANSI-capable terminal)\n"
        );
  printf("  -C --no-colours/no-colors\tDon\'t use colours\n");
  printf("  -x --xml <prefix>\t\tInstead of messages on stdout, write results into one XML-file\n");
  printf("\t\t\t\tper suite, compatible with Hudson/Jenkins CI. The filename(s)\n");
  printf("\t\t\t\twill be \'<prefix>-<suite>.xml\'\n");
  printf("  -X --libxml2 <prefix>\t\tFormat the test results using libxml2\n");
  printf("  -s --suite <name>\t\tName the top level suite\n");
  printf("  -n --no-run\t\t\tDon\'t run the tests\n");
  printf("  -v --verbose\t\t\tShow progress information\n");
  printf("  -q --quiet\t\t\tJust output dots for each test\n");
  printf("     --version\t\t\tShow version information\n");
  return;
}

Assistant:

static void usage(const char *program_name) {
    printf("cgreen-runner for Cgreen unittest and mocking framework v%s\n\n", VERSION);
    printf("Usage:\n    %s [--suite <name>] [--verbose] [--quiet] [--no-run] "
#if HAVE_XML_REPORTER
           "[--xml <prefix>] "
#endif
#if HAVE_LIBXML2_REPORTER
           "[--libxml2 <prefix>] "
#endif
           "[--help] (<library> [<test>])+\n\n", program_name);
    printf("Discover and run all or named cgreen test(s) from one or multiple\n");
    printf("dynamically loadable libraries.\n\n");
    printf("A single test can be run using the form [<context>:]<name> where <context> can\n");
    printf("be omitted if there is no context.\n\n");
    printf("  -c --colours/colors\t\tUse colours to emphasis result (requires ANSI-capable terminal)\n");
    printf("  -C --no-colours/no-colors\tDon't use colours\n");
#if HAVE_XML_REPORTER
    printf("  -x --xml <prefix>\t\tInstead of messages on stdout, write results into one XML-file\n");
    printf("\t\t\t\tper suite, compatible with Hudson/Jenkins CI. The filename(s)\n");
    printf("\t\t\t\twill be '<prefix>-<suite>.xml'\n");
#endif
#if HAVE_LIBXML2_REPORTER
    printf("  -X --libxml2 <prefix>\t\tFormat the test results using libxml2\n");
#endif
    printf("  -s --suite <name>\t\tName the top level suite\n");
    printf("  -n --no-run\t\t\tDon't run the tests\n");
    printf("  -v --verbose\t\t\tShow progress information\n");
    printf("  -q --quiet\t\t\tJust output dots for each test\n");
    printf("     --version\t\t\tShow version information\n");
}